

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O0

void __thiscall diy::Master::~Master(Master *this)

{
  Master *in_RDI;
  Master *unaff_retaddr;
  undefined8 in_stack_ffffffffffffffe8;
  
  set_immediate(in_RDI,SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0));
  clear(unaff_retaddr);
  if (in_RDI->queue_policy_ != (QueuePolicy *)0x0) {
    (*in_RDI->queue_policy_->_vptr_QueuePolicy[3])();
  }
  stats::Profiler::~Profiler((Profiler *)0x1180cc);
  std::shared_ptr<diy::spd::logger>::~shared_ptr((shared_ptr<diy::spd::logger> *)0x1180dd);
  std::
  vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  ::~vector((vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
             *)unaff_retaddr);
  std::unique_ptr<diy::Master::CollectivesMap,_std::default_delete<diy::Master::CollectivesMap>_>::
  ~unique_ptr((unique_ptr<diy::Master::CollectivesMap,_std::default_delete<diy::Master::CollectivesMap>_>
               *)in_RDI);
  std::
  unique_ptr<diy::Master::InFlightRecvsMap,_std::default_delete<diy::Master::InFlightRecvsMap>_>::
  ~unique_ptr((unique_ptr<diy::Master::InFlightRecvsMap,_std::default_delete<diy::Master::InFlightRecvsMap>_>
               *)in_RDI);
  std::
  unique_ptr<diy::Master::InFlightSendsList,_std::default_delete<diy::Master::InFlightSendsList>_>::
  ~unique_ptr((unique_ptr<diy::Master::InFlightSendsList,_std::default_delete<diy::Master::InFlightSendsList>_>
               *)in_RDI);
  std::
  map<int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
  ::~map((map<int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
          *)0x118132);
  std::
  map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
  ::~map((map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
          *)0x118143);
  mpi::communicator::~communicator((communicator *)0x118154);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x118165)
  ;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  Collection::~Collection((Collection *)in_RDI);
  std::vector<diy::Link_*,_std::allocator<diy::Link_*>_>::~vector(&unaff_retaddr->links_);
  return;
}

Assistant:

diy::Master::
~Master()
{
    set_immediate(true);
    clear();
    delete queue_policy_;
}